

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_choose_history(command *cmd)

{
  char *pcVar1;
  char *str;
  char *local_20;
  
  if (player->history != (char *)0x0) {
    string_free(player->history);
  }
  cmd_get_arg_string((command_conflict *)cmd,"history",&local_20);
  pcVar1 = string_make(local_20);
  player->history = pcVar1;
  return;
}

Assistant:

void do_cmd_choose_history(struct command *cmd)
{
	const char *str;

	/* Forget the old history */
	if (player->history)
		string_free(player->history);

	/* Get the new history */
	cmd_get_arg_string(cmd, "history", &str);
	player->history = string_make(str);
}